

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bit_field.cpp
# Opt level: O0

void __thiscall BitField_Addition_Test::~BitField_Addition_Test(BitField_Addition_Test *this)

{
  BitField_Addition_Test *this_local;
  
  ~BitField_Addition_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST (BitField, Addition) {
    union {
        std::uint8_t v;
        pstore::bit_field<std::uint8_t, 0, 2> f1;
    };
    v = 0U;
    pstore::bit_field<std::uint8_t, 0, 2> const r1 = ++f1;
    EXPECT_EQ (f1, 1U);
    EXPECT_EQ (r1, 1U);
    pstore::bit_field<std::uint8_t, 0, 2> const r2 = f1++;
    EXPECT_EQ (f1, 2U);
    EXPECT_EQ (r2, 1U);
    f1 = std::uint8_t{1};
    f1.operator+= (2U);
    EXPECT_EQ (f1, 3U);
    EXPECT_EQ (v, 3U);
}